

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,int _c,size_t _elemsize,int _elempack,
                 Allocator *_allocator)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 extraout_var;
  long lVar5;
  void *pvVar6;
  void *ptr;
  void *local_38;
  
  if ((((this->dims != 3) || (this->w != _w)) || (this->h != _h)) ||
     (((this->c != _c || (this->elemsize != _elemsize)) ||
      ((this->elempack != _elempack || (this->allocator != _allocator)))))) {
    piVar1 = this->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (this->allocator == (Allocator *)0x0) {
          if (this->data != (void *)0x0) {
            free(this->data);
          }
        }
        else {
          (*this->allocator->_vptr_Allocator[3])();
        }
      }
    }
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->elemsize = _elemsize;
    this->elempack = _elempack;
    this->allocator = _allocator;
    this->dims = 3;
    this->w = _w;
    this->h = _h;
    this->d = 1;
    this->c = _c;
    uVar3 = (long)_h * (long)_w * _elemsize + 0xf & 0xfffffffffffffff0;
    uVar4 = uVar3 / _elemsize;
    this->cstep = uVar4;
    lVar5 = (long)_c * uVar4;
    if (lVar5 != 0) {
      uVar4 = lVar5 * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        local_38 = (void *)0x0;
        iVar2 = posix_memalign(&local_38,0x10,uVar4 + 0x44);
        pvVar6 = (void *)0x0;
        if (iVar2 == 0) {
          pvVar6 = local_38;
        }
      }
      else {
        iVar2 = (*_allocator->_vptr_Allocator[2])(_allocator,uVar4 + 4,uVar3 % _elemsize);
        pvVar6 = (void *)CONCAT44(extraout_var,iVar2);
      }
      this->data = pvVar6;
      this->refcount = (int *)((long)pvVar6 + uVar4);
      *(undefined4 *)((long)pvVar6 + uVar4) = 1;
    }
  }
  return;
}

Assistant:

void Mat::create(int _w, int _h, int _c, size_t _elemsize, int _elempack, Allocator* _allocator)
{
    if (dims == 3 && w == _w && h == _h && c == _c && elemsize == _elemsize && elempack == _elempack && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = _elempack;
    allocator = _allocator;

    dims = 3;
    w = _w;
    h = _h;
    d = 1;
    c = _c;

    cstep = alignSize((size_t)w * h * elemsize, 16) / elemsize;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}